

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

char * __thiscall
TiXmlUnknown::Parse(TiXmlUnknown *this,char *p,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  TiXmlDocument *this_00;
  TiXmlParsingData *now;
  TiXmlCursor *pTVar1;
  bool bVar2;
  TiXmlDocument *document;
  TiXmlEncoding encoding_local;
  TiXmlParsingData *data_local;
  char *p_local;
  TiXmlUnknown *this_local;
  
  this_00 = TiXmlNode::GetDocument(&this->super_TiXmlNode);
  now = (TiXmlParsingData *)TiXmlBase::SkipWhiteSpace(p,encoding);
  if (data != (TiXmlParsingData *)0x0) {
    TiXmlParsingData::Stamp(data,(char *)now,encoding);
    pTVar1 = TiXmlParsingData::Cursor(data);
    (this->super_TiXmlNode).super_TiXmlBase.location = *pTVar1;
  }
  if (((now == (TiXmlParsingData *)0x0) || ((char)(now->cursor).row == '\0')) ||
     ((char)(now->cursor).row != '<')) {
    if (this_00 != (TiXmlDocument *)0x0) {
      TiXmlDocument::SetError(this_00,9,(char *)now,data,encoding);
    }
    this_local = (TiXmlUnknown *)0x0;
  }
  else {
    TiXmlString::operator=(&(this->super_TiXmlNode).value,"");
    while( true ) {
      data_local = (TiXmlParsingData *)((long)&(now->cursor).row + 1);
      bVar2 = false;
      if ((data_local != (TiXmlParsingData *)0x0) &&
         (bVar2 = false, (char)(data_local->cursor).row != '\0')) {
        bVar2 = (char)(data_local->cursor).row != '>';
      }
      if (!bVar2) break;
      TiXmlString::operator+=(&(this->super_TiXmlNode).value,(char)(data_local->cursor).row);
      now = data_local;
    }
    if ((data_local == (TiXmlParsingData *)0x0) && (this_00 != (TiXmlDocument *)0x0)) {
      TiXmlDocument::SetError(this_00,9,(char *)0x0,(TiXmlParsingData *)0x0,encoding);
    }
    if ((data_local == (TiXmlParsingData *)0x0) || ((char)(data_local->cursor).row != '>')) {
      this_local = (TiXmlUnknown *)data_local;
    }
    else {
      this_local = (TiXmlUnknown *)((long)&(now->cursor).row + 2);
    }
  }
  return (char *)this_local;
}

Assistant:

const char* TiXmlUnknown::Parse( const char* p, TiXmlParsingData* data, TiXmlEncoding encoding )
{
	TiXmlDocument* document = GetDocument();
	p = SkipWhiteSpace( p, encoding );

	if ( data )
	{
		data->Stamp( p, encoding );
		location = data->Cursor();
	}
	if ( !p || !*p || *p != '<' )
	{
		if ( document ) document->SetError( TIXML_ERROR_PARSING_UNKNOWN, p, data, encoding );
		return 0;
	}
	++p;
    value = "";

	while ( p && *p && *p != '>' )
	{
		value += *p;
		++p;
	}

	if ( !p )
	{
		if ( document )	
			document->SetError( TIXML_ERROR_PARSING_UNKNOWN, 0, 0, encoding );
	}
	if ( p && *p == '>' )
		return p+1;
	return p;
}